

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecPtr.h
# Opt level: O3

void Vec_PtrSetEntry(Vec_Ptr_t *p,int i,void *Entry)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void **ppvVar4;
  long lVar5;
  
  iVar3 = p->nSize;
  if (i < iVar3) goto LAB_008898a8;
  iVar1 = i + 1;
  iVar2 = p->nCap;
  if (i < iVar2 * 2) {
    if (iVar2 <= i) {
      if (p->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc((long)iVar2 << 4);
      }
      else {
        ppvVar4 = (void **)realloc(p->pArray,(long)iVar2 << 4);
      }
      p->pArray = ppvVar4;
      iVar3 = iVar2 * 2;
LAB_0088987f:
      p->nCap = iVar3;
      iVar3 = p->nSize;
    }
  }
  else if (iVar2 <= i) {
    if (p->pArray == (void **)0x0) {
      ppvVar4 = (void **)malloc((long)iVar1 << 3);
    }
    else {
      ppvVar4 = (void **)realloc(p->pArray,(long)iVar1 << 3);
    }
    p->pArray = ppvVar4;
    iVar3 = iVar1;
    goto LAB_0088987f;
  }
  if (iVar3 <= i) {
    lVar5 = (long)iVar3;
    do {
      p->pArray[lVar5] = (void *)0x0;
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  p->nSize = iVar1;
  iVar3 = iVar1;
LAB_008898a8:
  if ((-1 < i) && (i < iVar3)) {
    p->pArray[(uint)i] = Entry;
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
}

Assistant:

static inline void Vec_PtrSetEntry( Vec_Ptr_t * p, int i, void * Entry )
{
    Vec_PtrFillExtra( p, i + 1, NULL );
    Vec_PtrWriteEntry( p, i, Entry );
}